

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O3

size_t __thiscall Extension::SetDataSize(Extension *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  
  if ((this->critical).b == '\0') {
    lVar5 = 0;
  }
  else {
    uVar1 = (this->critical).super_DerBase.cbData;
    lVar5 = 2;
    if (((((0x7f < uVar1) && (lVar5 = 3, 0xff < uVar1)) && (lVar5 = 4, 0xffff < uVar1)) &&
        ((lVar5 = 5, 0xffffff < uVar1 && (lVar5 = 6, uVar1 >> 0x20 != 0)))) &&
       (lVar5 = 7, uVar1 >> 0x28 != 0)) {
      lVar5 = (ulong)(uVar1 >> 0x30 == 0) << 3;
    }
    lVar5 = lVar5 + uVar1;
  }
  uVar1 = (this->extnID).super_DerBase.cbData;
  lVar6 = 2;
  lVar3 = 2;
  if (((0x7f < uVar1) && (lVar3 = 3, 0xff < uVar1)) &&
     ((lVar3 = 4, 0xffff < uVar1 &&
      (((lVar3 = 5, 0xffffff < uVar1 && (lVar3 = 6, uVar1 >> 0x20 != 0)) &&
       (lVar3 = 7, uVar1 >> 0x28 != 0)))))) {
    lVar3 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  uVar2 = (this->extnValue).super_DerBase.cbData;
  if ((((0x7f < uVar2) && (lVar6 = 3, 0xff < uVar2)) &&
      ((lVar6 = 4, 0xffff < uVar2 &&
       ((lVar6 = 5, 0xffffff < uVar2 && (lVar6 = 6, uVar2 >> 0x20 != 0)))))) &&
     (lVar6 = 7, uVar2 >> 0x28 != 0)) {
    lVar6 = (ulong)(uVar2 >> 0x30 == 0) << 3;
  }
  sVar4 = lVar3 + uVar2 + uVar1 + lVar5 + lVar6;
  (this->super_DerBase).cbData = sVar4;
  return sVar4;
}

Assistant:

virtual size_t SetDataSize() override
	{
		size_t cbCritical = critical.GetValue() ? critical.EncodedSize() : 0;
		cbData = extnID.EncodedSize() + cbCritical + extnValue.EncodedSize();
		return cbData;
	}